

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void walLimitSize(Wal *pWal,i64 nMax)

{
  int iErrCode;
  long in_FS_OFFSET;
  i64 sz;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  if (sqlite3Hooks_0 != (code *)0x0) {
    (*sqlite3Hooks_0)();
  }
  iErrCode = (*pWal->pWalFd->pMethods->xFileSize)(pWal->pWalFd,(sqlite3_int64 *)&local_28);
  if ((iErrCode == 0) && (iErrCode = 0, nMax < (long)local_28)) {
    iErrCode = (*pWal->pWalFd->pMethods->xTruncate)(pWal->pWalFd,nMax);
  }
  if (sqlite3Hooks_1 != (code *)0x0) {
    (*sqlite3Hooks_1)();
  }
  if (iErrCode != 0) {
    sqlite3_log(iErrCode,"cannot limit WAL size: %s",pWal->zWalName);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void walLimitSize(Wal *pWal, i64 nMax){
  i64 sz;
  int rx;
  sqlite3BeginBenignMalloc();
  rx = sqlite3OsFileSize(pWal->pWalFd, &sz);
  if( rx==SQLITE_OK && (sz > nMax ) ){
    rx = sqlite3OsTruncate(pWal->pWalFd, nMax);
  }
  sqlite3EndBenignMalloc();
  if( rx ){
    sqlite3_log(rx, "cannot limit WAL size: %s", pWal->zWalName);
  }
}